

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86_fma.cpp
# Opt level: O3

int ncnn::binary_op_no_broadcast(Mat *a,Mat *b,Mat *c,int op_type,Option *opt)

{
  undefined1 auVar1 [32];
  int iVar2;
  Mat *in_RAX;
  Option *opt_00;
  undefined1 (*pauVar3) [64];
  int iVar4;
  uint uVar5;
  Mat *pMVar6;
  uint uVar7;
  long lVar8;
  undefined1 (*pauVar9) [64];
  undefined1 (*pauVar10) [64];
  uint uVar11;
  long lVar12;
  undefined1 auVar13 [64];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [32];
  
  if (0xb < (uint)op_type) goto switchD_00387d49_default;
  opt_00 = (Option *)
           ((long)&switchD_00387d49::switchdataD_0055bc9c +
           (long)(int)(&switchD_00387d49::switchdataD_0055bc9c)[(uint)op_type]);
  in_RAX = a;
  switch(op_type) {
  case 0:
    iVar2 = a->c;
    if (0 < (long)iVar2) {
      uVar7 = a->h * a->w * a->d * a->elempack;
      lVar8 = 0;
      do {
        pauVar9 = (undefined1 (*) [64])(a->cstep * lVar8 * a->elemsize + (long)a->data);
        pauVar10 = (undefined1 (*) [64])(b->cstep * lVar8 * b->elemsize + (long)b->data);
        pauVar3 = (undefined1 (*) [64])(c->cstep * lVar8 * c->elemsize + (long)c->data);
        if ((int)uVar7 < 0x10) {
          uVar11 = 0;
        }
        else {
          iVar4 = 0xf;
          do {
            auVar13 = vaddps_avx512f(*pauVar10,*pauVar9);
            *pauVar3 = auVar13;
            pauVar9 = pauVar9 + 1;
            pauVar10 = pauVar10 + 1;
            pauVar3 = pauVar3 + 1;
            iVar4 = iVar4 + 0x10;
            uVar11 = uVar7 & 0xfffffff0;
          } while (iVar4 < (int)uVar7);
        }
        uVar5 = uVar11 | 7;
        while ((int)uVar5 < (int)uVar7) {
          auVar16._0_4_ = *(float *)*pauVar10 + *(float *)*pauVar9;
          auVar16._4_4_ = *(float *)(*pauVar10 + 4) + *(float *)(*pauVar9 + 4);
          auVar16._8_4_ = *(float *)(*pauVar10 + 8) + *(float *)(*pauVar9 + 8);
          auVar16._12_4_ = *(float *)(*pauVar10 + 0xc) + *(float *)(*pauVar9 + 0xc);
          auVar16._16_4_ = *(float *)(*pauVar10 + 0x10) + *(float *)(*pauVar9 + 0x10);
          auVar16._20_4_ = *(float *)(*pauVar10 + 0x14) + *(float *)(*pauVar9 + 0x14);
          auVar16._24_4_ = *(float *)(*pauVar10 + 0x18) + *(float *)(*pauVar9 + 0x18);
          auVar16._28_4_ = *(float *)(*pauVar10 + 0x1c) + *(float *)(*pauVar9 + 0x1c);
          *(undefined1 (*) [32])*pauVar3 = auVar16;
          pauVar9 = (undefined1 (*) [64])(*pauVar9 + 0x20);
          pauVar10 = (undefined1 (*) [64])(*pauVar10 + 0x20);
          pauVar3 = (undefined1 (*) [64])((long)*pauVar3 + 0x20);
          uVar5 = uVar11 + 0xf;
          uVar11 = uVar11 + 8;
        }
        uVar5 = uVar11 | 3;
        while ((int)uVar5 < (int)uVar7) {
          auVar14._0_4_ = *(float *)*pauVar10 + *(float *)*pauVar9;
          auVar14._4_4_ = *(float *)(*pauVar10 + 4) + *(float *)(*pauVar9 + 4);
          auVar14._8_4_ = *(float *)(*pauVar10 + 8) + *(float *)(*pauVar9 + 8);
          auVar14._12_4_ = *(float *)(*pauVar10 + 0xc) + *(float *)(*pauVar9 + 0xc);
          *(undefined1 (*) [16])*pauVar3 = auVar14;
          pauVar9 = (undefined1 (*) [64])(*pauVar9 + 0x10);
          pauVar10 = (undefined1 (*) [64])(*pauVar10 + 0x10);
          pauVar3 = (undefined1 (*) [64])((long)*pauVar3 + 0x10);
          uVar5 = uVar11 + 7;
          uVar11 = uVar11 + 4;
        }
        if (uVar7 - uVar11 != 0 && (int)uVar11 <= (int)uVar7) {
          lVar12 = 0;
          do {
            *(float *)((long)*pauVar3 + lVar12 * 4) =
                 *(float *)(*pauVar10 + lVar12 * 4) + *(float *)(*pauVar9 + lVar12 * 4);
            lVar12 = lVar12 + 1;
          } while (uVar7 - uVar11 != (int)lVar12);
        }
        lVar8 = lVar8 + 1;
      } while (lVar8 != iVar2);
    }
    break;
  case 1:
    pMVar6 = b;
    b = a;
    goto LAB_003880f5;
  case 2:
    iVar2 = a->c;
    if (0 < (long)iVar2) {
      uVar7 = a->h * a->w * a->d * a->elempack;
      lVar8 = 0;
      do {
        pauVar9 = (undefined1 (*) [64])(a->cstep * lVar8 * a->elemsize + (long)a->data);
        pauVar10 = (undefined1 (*) [64])(b->cstep * lVar8 * b->elemsize + (long)b->data);
        pauVar3 = (undefined1 (*) [64])(c->cstep * lVar8 * c->elemsize + (long)c->data);
        if ((int)uVar7 < 0x10) {
          uVar11 = 0;
        }
        else {
          iVar4 = 0xf;
          do {
            auVar13 = vmulps_avx512f(*pauVar10,*pauVar9);
            *pauVar3 = auVar13;
            pauVar9 = pauVar9 + 1;
            pauVar10 = pauVar10 + 1;
            pauVar3 = pauVar3 + 1;
            iVar4 = iVar4 + 0x10;
            uVar11 = uVar7 & 0xfffffff0;
          } while (iVar4 < (int)uVar7);
        }
        uVar5 = uVar11 | 7;
        while ((int)uVar5 < (int)uVar7) {
          auVar1._4_4_ = *(float *)(*pauVar10 + 4) * *(float *)(*pauVar9 + 4);
          auVar1._0_4_ = *(float *)*pauVar10 * *(float *)*pauVar9;
          auVar1._8_4_ = *(float *)(*pauVar10 + 8) * *(float *)(*pauVar9 + 8);
          auVar1._12_4_ = *(float *)(*pauVar10 + 0xc) * *(float *)(*pauVar9 + 0xc);
          auVar1._16_4_ = *(float *)(*pauVar10 + 0x10) * *(float *)(*pauVar9 + 0x10);
          auVar1._20_4_ = *(float *)(*pauVar10 + 0x14) * *(float *)(*pauVar9 + 0x14);
          auVar1._24_4_ = *(float *)(*pauVar10 + 0x18) * *(float *)(*pauVar9 + 0x18);
          auVar1._28_4_ = *(undefined4 *)(*pauVar10 + 0x1c);
          *(undefined1 (*) [32])*pauVar3 = auVar1;
          pauVar9 = (undefined1 (*) [64])(*pauVar9 + 0x20);
          pauVar10 = (undefined1 (*) [64])(*pauVar10 + 0x20);
          pauVar3 = (undefined1 (*) [64])((long)*pauVar3 + 0x20);
          uVar5 = uVar11 + 0xf;
          uVar11 = uVar11 + 8;
        }
        uVar5 = uVar11 | 3;
        while ((int)uVar5 < (int)uVar7) {
          auVar15._0_4_ = *(float *)*pauVar10 * *(float *)*pauVar9;
          auVar15._4_4_ = *(float *)(*pauVar10 + 4) * *(float *)(*pauVar9 + 4);
          auVar15._8_4_ = *(float *)(*pauVar10 + 8) * *(float *)(*pauVar9 + 8);
          auVar15._12_4_ = *(float *)(*pauVar10 + 0xc) * *(float *)(*pauVar9 + 0xc);
          *(undefined1 (*) [16])*pauVar3 = auVar15;
          pauVar9 = (undefined1 (*) [64])(*pauVar9 + 0x10);
          pauVar10 = (undefined1 (*) [64])(*pauVar10 + 0x10);
          pauVar3 = (undefined1 (*) [64])((long)*pauVar3 + 0x10);
          uVar5 = uVar11 + 7;
          uVar11 = uVar11 + 4;
        }
        if (uVar7 - uVar11 != 0 && (int)uVar11 <= (int)uVar7) {
          lVar12 = 0;
          do {
            *(float *)((long)*pauVar3 + lVar12 * 4) =
                 *(float *)(*pauVar10 + lVar12 * 4) * *(float *)(*pauVar9 + lVar12 * 4);
            lVar12 = lVar12 + 1;
          } while (uVar7 - uVar11 != (int)lVar12);
        }
        lVar8 = lVar8 + 1;
      } while (lVar8 != iVar2);
    }
    break;
  case 3:
    pMVar6 = b;
    b = a;
    goto LAB_00388252;
  case 4:
    iVar2 = a->c;
    if (0 < (long)iVar2) {
      uVar7 = a->h * a->w * a->d * a->elempack;
      lVar8 = 0;
      do {
        pauVar9 = (undefined1 (*) [64])(a->cstep * lVar8 * a->elemsize + (long)a->data);
        pauVar10 = (undefined1 (*) [64])(b->cstep * lVar8 * b->elemsize + (long)b->data);
        pauVar3 = (undefined1 (*) [64])(c->cstep * lVar8 * c->elemsize + (long)c->data);
        if ((int)uVar7 < 0x10) {
          uVar11 = 0;
        }
        else {
          iVar4 = 0xf;
          do {
            auVar13 = vmaxps_avx512f(*pauVar9,*pauVar10);
            *pauVar3 = auVar13;
            pauVar9 = pauVar9 + 1;
            pauVar10 = pauVar10 + 1;
            pauVar3 = pauVar3 + 1;
            iVar4 = iVar4 + 0x10;
            uVar11 = uVar7 & 0xfffffff0;
          } while (iVar4 < (int)uVar7);
        }
        uVar5 = uVar11 | 7;
        while ((int)uVar5 < (int)uVar7) {
          auVar1 = vmaxps_avx(*(undefined1 (*) [32])*pauVar9,*(undefined1 (*) [32])*pauVar10);
          *(undefined1 (*) [32])*pauVar3 = auVar1;
          pauVar9 = (undefined1 (*) [64])(*pauVar9 + 0x20);
          pauVar10 = (undefined1 (*) [64])(*pauVar10 + 0x20);
          pauVar3 = (undefined1 (*) [64])((long)*pauVar3 + 0x20);
          uVar5 = uVar11 + 0xf;
          uVar11 = uVar11 + 8;
        }
        uVar5 = uVar11 | 3;
        while ((int)uVar5 < (int)uVar7) {
          auVar15 = vmaxps_avx(*(undefined1 (*) [16])*pauVar9,*(undefined1 (*) [16])*pauVar10);
          *(undefined1 (*) [16])*pauVar3 = auVar15;
          pauVar9 = (undefined1 (*) [64])(*pauVar9 + 0x10);
          pauVar10 = (undefined1 (*) [64])(*pauVar10 + 0x10);
          pauVar3 = (undefined1 (*) [64])((long)*pauVar3 + 0x10);
          uVar5 = uVar11 + 7;
          uVar11 = uVar11 + 4;
        }
        if (uVar7 - uVar11 != 0 && (int)uVar11 <= (int)uVar7) {
          lVar12 = 0;
          do {
            auVar15 = vmaxss_avx(ZEXT416(*(uint *)(*pauVar10 + lVar12 * 4)),
                                 ZEXT416(*(uint *)(*pauVar9 + lVar12 * 4)));
            *(int *)((long)*pauVar3 + lVar12 * 4) = auVar15._0_4_;
            lVar12 = lVar12 + 1;
          } while (uVar7 - uVar11 != (int)lVar12);
        }
        lVar8 = lVar8 + 1;
      } while (lVar8 != iVar2);
    }
    break;
  case 5:
    iVar2 = a->c;
    if (0 < (long)iVar2) {
      uVar7 = a->h * a->w * a->d * a->elempack;
      lVar8 = 0;
      do {
        pauVar9 = (undefined1 (*) [64])(a->cstep * lVar8 * a->elemsize + (long)a->data);
        pauVar10 = (undefined1 (*) [64])(b->cstep * lVar8 * b->elemsize + (long)b->data);
        pauVar3 = (undefined1 (*) [64])(c->cstep * lVar8 * c->elemsize + (long)c->data);
        if ((int)uVar7 < 0x10) {
          uVar11 = 0;
        }
        else {
          iVar4 = 0xf;
          do {
            auVar13 = vminps_avx512f(*pauVar9,*pauVar10);
            *pauVar3 = auVar13;
            pauVar9 = pauVar9 + 1;
            pauVar10 = pauVar10 + 1;
            pauVar3 = pauVar3 + 1;
            iVar4 = iVar4 + 0x10;
            uVar11 = uVar7 & 0xfffffff0;
          } while (iVar4 < (int)uVar7);
        }
        uVar5 = uVar11 | 7;
        while ((int)uVar5 < (int)uVar7) {
          auVar1 = vminps_avx(*(undefined1 (*) [32])*pauVar9,*(undefined1 (*) [32])*pauVar10);
          *(undefined1 (*) [32])*pauVar3 = auVar1;
          pauVar9 = (undefined1 (*) [64])(*pauVar9 + 0x20);
          pauVar10 = (undefined1 (*) [64])(*pauVar10 + 0x20);
          pauVar3 = (undefined1 (*) [64])((long)*pauVar3 + 0x20);
          uVar5 = uVar11 + 0xf;
          uVar11 = uVar11 + 8;
        }
        uVar5 = uVar11 | 3;
        while ((int)uVar5 < (int)uVar7) {
          auVar15 = vminps_avx(*(undefined1 (*) [16])*pauVar9,*(undefined1 (*) [16])*pauVar10);
          *(undefined1 (*) [16])*pauVar3 = auVar15;
          pauVar9 = (undefined1 (*) [64])(*pauVar9 + 0x10);
          pauVar10 = (undefined1 (*) [64])(*pauVar10 + 0x10);
          pauVar3 = (undefined1 (*) [64])((long)*pauVar3 + 0x10);
          uVar5 = uVar11 + 7;
          uVar11 = uVar11 + 4;
        }
        if (uVar7 - uVar11 != 0 && (int)uVar11 <= (int)uVar7) {
          lVar12 = 0;
          do {
            auVar15 = vminss_avx(ZEXT416(*(uint *)(*pauVar10 + lVar12 * 4)),
                                 ZEXT416(*(uint *)(*pauVar9 + lVar12 * 4)));
            *(int *)((long)*pauVar3 + lVar12 * 4) = auVar15._0_4_;
            lVar12 = lVar12 + 1;
          } while (uVar7 - uVar11 != (int)lVar12);
        }
        lVar8 = lVar8 + 1;
      } while (lVar8 != iVar2);
    }
    break;
  case 6:
    pMVar6 = b;
    b = a;
    goto LAB_00388233;
  case 7:
    pMVar6 = a;
LAB_003880f5:
    iVar2 = binary_op_no_broadcast<ncnn::BinaryOp_x86_avx512_functor::binary_op_sub>
                      (b,pMVar6,c,opt_00);
    return iVar2;
  case 8:
    pMVar6 = a;
LAB_00388252:
    iVar2 = binary_op_no_broadcast<ncnn::BinaryOp_x86_avx512_functor::binary_op_div>
                      (b,pMVar6,c,opt_00);
    return iVar2;
  case 9:
    pMVar6 = a;
LAB_00388233:
    iVar2 = binary_op_no_broadcast<ncnn::BinaryOp_x86_avx512_functor::binary_op_pow>
                      (b,pMVar6,c,opt_00);
    return iVar2;
  case 10:
    pMVar6 = b;
    b = a;
    goto LAB_00388241;
  case 0xb:
    pMVar6 = a;
LAB_00388241:
    iVar2 = binary_op_no_broadcast<ncnn::BinaryOp_x86_avx512_functor::binary_op_atan2>
                      (b,pMVar6,c,opt_00);
    return iVar2;
  }
switchD_00387d49_default:
  return (int)in_RAX;
}

Assistant:

static int binary_op_no_broadcast(const Mat& a, const Mat& b, Mat& c, int op_type, const Option& opt)
{
    using namespace BinaryOp_x86_fma_functor;

    if (op_type == BinaryOp::Operation_ADD) return binary_op_no_broadcast<binary_op_add>(a, b, c, opt);
    if (op_type == BinaryOp::Operation_SUB) return binary_op_no_broadcast<binary_op_sub>(a, b, c, opt);
    if (op_type == BinaryOp::Operation_MUL) return binary_op_no_broadcast<binary_op_mul>(a, b, c, opt);
    if (op_type == BinaryOp::Operation_DIV) return binary_op_no_broadcast<binary_op_div>(a, b, c, opt);
    if (op_type == BinaryOp::Operation_MAX) return binary_op_no_broadcast<binary_op_max>(a, b, c, opt);
    if (op_type == BinaryOp::Operation_MIN) return binary_op_no_broadcast<binary_op_min>(a, b, c, opt);
    if (op_type == BinaryOp::Operation_POW) return binary_op_no_broadcast<binary_op_pow>(a, b, c, opt);
    if (op_type == BinaryOp::Operation_RSUB) return binary_op_no_broadcast<binary_op_sub>(b, a, c, opt);
    if (op_type == BinaryOp::Operation_RDIV) return binary_op_no_broadcast<binary_op_div>(b, a, c, opt);
    if (op_type == BinaryOp::Operation_RPOW) return binary_op_no_broadcast<binary_op_pow>(b, a, c, opt);
    if (op_type == BinaryOp::Operation_ATAN2) return binary_op_no_broadcast<binary_op_atan2>(a, b, c, opt);
    if (op_type == BinaryOp::Operation_RATAN2) return binary_op_no_broadcast<binary_op_atan2>(b, a, c, opt);

    // should never reach here
    return 0;
}